

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O2

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::prune_to_min_complement
          (tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this,double *m)

{
  pointer pvVar1;
  pointer pdVar2;
  pointer pdVar3;
  const_iterator __last;
  pointer pvVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  uint uVar5;
  ulong uVar6;
  
  if (8.900295434028806e-308 < *m) {
    uVar5 = 0;
    while( true ) {
      uVar6 = (ulong)uVar5;
      pvVar1 = (this->m_abscissas).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_abscissas).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar6
         ) break;
      pdVar2 = *(pointer *)
                &pvVar1[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl;
      pdVar3 = *(pointer *)
                ((long)&pvVar1[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl +
                8);
      if (pdVar3 == pdVar2) {
        return;
      }
      __first = std::
                __lower_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,__gnu_cxx::__ops::_Iter_comp_val<boost::math::quadrature::detail::tanh_sinh_detail<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>::prune_to_min_complement(double_const&)::_lambda(double_const&,double_const&)_1_>>
                          (pdVar2,pdVar3,m);
      pvVar1 = (this->m_abscissas).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           *(pointer *)
            ((long)&pvVar1[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl + 8);
      if (__first._M_current != __last._M_current) {
        std::vector<double,_std::allocator<double>_>::erase
                  (pvVar1 + uVar6,(const_iterator)__first._M_current,__last);
        pvVar1 = (this->m_abscissas).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this->m_weights).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<double,_std::allocator<double>_>::erase
                  (pvVar4 + uVar6,
                   (double *)
                   ((long)*(pointer *)
                           ((long)&pvVar1[uVar6].super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl + 8) +
                   (*(long *)&pvVar4[uVar6].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data -
                   *(long *)&pvVar1[uVar6].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl)),
                   (const_iterator)
                   *(pointer *)
                    ((long)&pvVar4[uVar6].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8));
      }
      uVar5 = uVar5 + 1;
    }
  }
  return;
}

Assistant:

void tanh_sinh_detail<Real, Policy>::prune_to_min_complement(const Real& m)
{
   //
   // If our tables were constructed from pre-computed data, then they will have more values stored than we can ever use,
   // and although the table size at this stage won't be too large, if we calculate down to m_max_levels then they will
   // grow by a huge amount - doubling in size at each step - so lets prune them down, removing values which will never
   // be used:
   //
   if (m > tools::min_value<Real>() * 4)
   {
      for (unsigned row = 0; (row < m_abscissas.size()) && m_abscissas[row].size(); ++row)
      {
         typename std::vector<Real>::iterator pos = std::lower_bound(m_abscissas[row].begin(), m_abscissas[row].end(), m, [](const Real& a, const Real& b) { using std::fabs; return fabs(a) > fabs(b); });
         if (pos != m_abscissas[row].end())
         {
            m_abscissas[row].erase(pos, m_abscissas[row].end());
            m_weights[row].erase(m_weights[row].begin() + m_abscissas[row].size(), m_weights[row].end());
         }
      }
   }
}